

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButtonPrivate::moveFocus(QAbstractButtonPrivate *this,int key)

{
  QWidgetData *pQVar1;
  QWidget *this_00;
  long lVar2;
  byte bVar3;
  bool bVar4;
  Representation RVar5;
  FocusPolicy FVar6;
  QWidget *this_01;
  long lVar7;
  QPoint QVar8;
  QWidget *pQVar9;
  QWidget *pQVar10;
  QPoint QVar11;
  long lVar12;
  FocusPolicy FVar13;
  long in_RCX;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  Representation RVar24;
  undefined1 *puVar25;
  long in_FS_OFFSET;
  bool bVar26;
  int local_a4;
  QWidget *local_a0;
  int local_98;
  int local_90;
  QPoint local_60;
  QList<QAbstractButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  queryButtonList(&local_58,this);
  if (this->group == (QButtonGroup *)0x0) {
    bVar3 = (byte)this->field_0x28c >> 3 & 1;
  }
  else {
    bVar3 = *(byte *)(*(long *)&this->group->field_0x8 + 0xa0);
  }
  this_01 = QApplication::focusWidget();
  lVar7 = QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
  if (lVar7 == 0) goto LAB_003c4787;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_003c4476:
    in_RCX = -1;
  }
  else {
    lVar14 = -8;
    do {
      lVar15 = local_58.d.size * -8 + lVar14;
      if (lVar15 == -8) goto LAB_003c4470;
      in_RCX = lVar14 + 8;
      lVar12 = lVar14 + 8;
      lVar14 = in_RCX;
    } while (*(long *)((long)local_58.d.ptr + lVar12) != lVar7);
    in_RCX = in_RCX >> 3;
LAB_003c4470:
    if (lVar15 == -8) goto LAB_003c4476;
  }
  if (in_RCX != -1) {
    pQVar1 = this_01->data;
    iVar19 = (pQVar1->crect).x2.m_i;
    iVar22 = (pQVar1->crect).y2.m_i;
    iVar17 = (pQVar1->crect).x1.m_i;
    iVar21 = (pQVar1->crect).y1.m_i;
    local_60.xp.m_i = 0;
    local_60.yp.m_i = 0;
    QVar8 = QWidget::mapToGlobal(this_01,&local_60);
    bVar4 = qt_tab_all_widgets();
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
      local_a0 = (QWidget *)0x0;
    }
    else {
      RVar24 = QVar8.xp.m_i;
      iVar19 = (iVar19 - iVar17) + RVar24.m_i;
      iVar22 = (iVar22 - iVar21) + QVar8.yp.m_i.m_i;
      lVar14 = ((long)iVar19 + (long)RVar24.m_i) / 2;
      lVar15 = ((long)iVar22 + ((long)QVar8 >> 0x20)) / 2;
      FVar13 = ~StrongFocus;
      if (bVar4) {
        FVar13 = ~TabFocus;
      }
      local_a4 = -1;
      puVar25 = (undefined1 *)0x0;
      local_a0 = (QWidget *)0x0;
      do {
        this_00 = &local_58.d.ptr[(long)puVar25]->super_QWidget;
        if (this_00 == this_01) goto switchD_003c46de_default;
        pQVar9 = QWidget::window(this_00);
        pQVar10 = QWidget::window(this_01);
        if (((pQVar9 != pQVar10) || ((this_00->data->widget_attributes & 0x10001) != 0)) ||
           ((bVar3 == 0 && (FVar6 = QWidget::focusPolicy(this_00), (FVar6 | FVar13) != ~NoFocus))))
        goto switchD_003c46de_default;
        pQVar1 = this_00->data;
        iVar17 = (pQVar1->crect).x2.m_i;
        iVar21 = (pQVar1->crect).x1.m_i;
        iVar23 = (pQVar1->crect).y2.m_i;
        iVar20 = (pQVar1->crect).y1.m_i;
        local_60.xp.m_i = 0;
        local_60.yp.m_i = 0;
        QVar11 = QWidget::mapToGlobal(this_00,&local_60);
        RVar5 = QVar11.xp.m_i;
        iVar18 = (iVar17 - iVar21) + RVar5.m_i;
        iVar23 = (iVar23 - iVar20) + QVar11.yp.m_i.m_i;
        lVar16 = ((long)iVar18 + (long)RVar5.m_i) / 2;
        lVar12 = ((long)iVar23 + ((long)QVar11 >> 0x20)) / 2;
        iVar17 = (int)lVar12;
        iVar21 = (int)lVar16;
        local_98 = (int)lVar15;
        local_90 = (int)lVar14;
        if (((RVar5.m_i < iVar19) && (RVar24.m_i < iVar18)) &&
           ((key == 0x1000015 || (key == 0x1000013)))) {
          iVar17 = iVar17 - local_98;
          iVar20 = -iVar17;
          if (0 < iVar17) {
            iVar20 = iVar17;
          }
          iVar21 = iVar21 - local_90;
          iVar23 = -iVar21;
          if (0 < iVar21) {
            iVar23 = iVar21;
          }
          iVar23 = iVar23 + iVar20 * 0x10000;
        }
        else if (((QVar11.yp.m_i < iVar22) && (QVar8.yp.m_i < iVar23)) &&
                ((key == 0x1000014 || (key == 0x1000012)))) {
          iVar21 = iVar21 - local_90;
          iVar20 = -iVar21;
          if (0 < iVar21) {
            iVar20 = iVar21;
          }
          iVar17 = iVar17 - local_98;
          iVar23 = -iVar17;
          if (0 < iVar17) {
            iVar23 = iVar17;
          }
          iVar23 = iVar23 + iVar20 * 0x10000;
        }
        else {
          iVar23 = (iVar17 - local_98) * (iVar17 - local_98) +
                   (iVar21 - local_90) * (iVar21 - local_90) + 0x40000000;
        }
        if ((local_a4 < iVar23) && (local_a0 != (QWidget *)0x0)) goto switchD_003c46de_default;
        switch(key) {
        case 0x1000012:
          bVar4 = SBORROW8(lVar16,lVar14);
          lVar12 = lVar16 - lVar14;
          break;
        case 0x1000013:
          bVar4 = SBORROW8(lVar12,lVar15);
          lVar12 = lVar12 - lVar15;
          break;
        case 0x1000014:
          bVar26 = SBORROW8(lVar16,lVar14);
          lVar2 = lVar16 - lVar14;
          bVar4 = lVar16 == lVar14;
          goto LAB_003c46f4;
        case 0x1000015:
          bVar26 = SBORROW8(lVar12,lVar15);
          lVar2 = lVar12 - lVar15;
          bVar4 = lVar12 == lVar15;
LAB_003c46f4:
          if (!bVar4 && bVar26 == lVar2 < 0) {
            local_a4 = iVar23;
            local_a0 = this_00;
          }
        default:
          goto switchD_003c46de_default;
        }
        if (bVar4 != lVar12 < 0) {
          local_a4 = iVar23;
          local_a0 = this_00;
        }
switchD_003c46de_default:
        puVar25 = puVar25 + 1;
      } while (puVar25 < (ulong)local_58.d.size);
    }
    if ((((bVar3 != 0) && (local_a0 != (QWidget *)0x0)) &&
        ((*(byte *)(*(long *)(lVar7 + 8) + 0x28c) & 2) != 0)) &&
       ((*(byte *)(*(long *)&local_a0->field_0x8 + 0x28c) & 1) != 0)) {
      QAbstractButton::click((QAbstractButton *)local_a0);
    }
    if (local_a0 != (QWidget *)0x0) {
      QWidget::setFocus(local_a0,((key & 0xfffffffeU) == 0x1000012) + TabFocusReason);
    }
  }
LAB_003c4787:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::moveFocus(int key)
{
    QList<QAbstractButton *> buttonList = queryButtonList();
#if QT_CONFIG(buttongroup)
    bool exclusive = group ? group->d_func()->exclusive : autoExclusive;
#else
    bool exclusive = autoExclusive;
#endif
    QWidget *f = QApplication::focusWidget();
    QAbstractButton *fb = qobject_cast<QAbstractButton *>(f);
    if (!fb || !buttonList.contains(fb))
        return;

    QAbstractButton *candidate = nullptr;
    int bestScore = -1;
    QRect target = f->rect().translated(f->mapToGlobal(QPoint(0,0)));
    QPoint goal = target.center();
    uint focus_flag = qt_tab_all_widgets() ? Qt::TabFocus : Qt::StrongFocus;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *button = buttonList.at(i);
        if (button != f && button->window() == f->window() && button->isEnabled() && !button->isHidden() &&
            (exclusive || (button->focusPolicy() & focus_flag) == focus_flag)) {
            QRect buttonRect = button->rect().translated(button->mapToGlobal(QPoint(0,0)));
            QPoint p = buttonRect.center();

            //Priority to widgets that overlap on the same coordinate.
            //In that case, the distance in the direction will be used as significant score,
            //take also in account orthogonal distance in case two widget are in the same distance.
            int score;
            if ((buttonRect.x() < target.right() && target.x() < buttonRect.right())
                  && (key == Qt::Key_Up || key == Qt::Key_Down)) {
                //one item's is at the vertical of the other
                score = (qAbs(p.y() - goal.y()) << 16) + qAbs(p.x() - goal.x());
            } else if ((buttonRect.y() < target.bottom() && target.y() < buttonRect.bottom())
                        && (key == Qt::Key_Left || key == Qt::Key_Right) ) {
                //one item's is at the horizontal of the other
                score = (qAbs(p.x() - goal.x()) << 16) + qAbs(p.y() - goal.y());
            } else {
                score = (1 << 30) + (p.y() - goal.y()) * (p.y() - goal.y()) + (p.x() - goal.x()) * (p.x() - goal.x());
            }

            if (score > bestScore && candidate)
                continue;

            switch(key) {
            case Qt::Key_Up:
                if (p.y() < goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Down:
                if (p.y() > goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Left:
                if (p.x() < goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Right:
                if (p.x() > goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            }
        }
    }

    if (exclusive
#ifdef QT_KEYPAD_NAVIGATION
        && !QApplicationPrivate::keypadNavigationEnabled()
#endif
        && candidate
        && fb->d_func()->checked
        && candidate->d_func()->checkable)
        candidate->click();

    if (candidate) {
        if (key == Qt::Key_Up || key == Qt::Key_Left)
            candidate->setFocus(Qt::BacktabFocusReason);
        else
            candidate->setFocus(Qt::TabFocusReason);
    }
}